

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

void __thiscall cmCTestCoverageHandler::LoadLabels(cmCTestCoverageHandler *this,char *dir)

{
  cmCTest *this_00;
  iterator iVar1;
  bool bVar2;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *p_Var3;
  ostream *poVar4;
  bool bVar5;
  int *__v;
  LabelMapType *this_01;
  int id;
  string line;
  vector<int,_std::allocator<int>_> targetLabels;
  string label;
  string fname;
  string source;
  ifstream fin;
  int local_44c;
  string local_448;
  int *local_428;
  iterator iStack_420;
  int *local_418;
  cmCTestCoverageHandler *local_408;
  undefined1 local_400 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  long *local_3e0;
  long local_3d8;
  long local_3d0 [2];
  LabelMapType *local_3c0;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_3b8;
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [6];
  ios_base local_340 [264];
  key_type local_238;
  byte abStack_218 [488];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,dir,(allocator<char> *)local_3b0);
  p_Var3 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
           ::operator[](&this->TargetDirs,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,dir,(allocator<char> *)&local_238);
  std::__cxx11::string::append((char *)&local_3e0);
  std::ifstream::ifstream(&local_238,(char *)local_3e0,_S_in);
  if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0," loading labels from [",0x16);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3b0,(char *)local_3e0,local_3d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x8cc,local_448._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
    local_3b8 = p_Var3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,
                      CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                               local_448.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
    local_3b0._0_8_ = local_3b0 + 0x10;
    local_3b0._8_8_ = 0;
    local_3a0[0]._M_local_buf[0] = '\0';
    local_448._M_string_length = 0;
    local_448.field_2._M_local_buf[0] = '\0';
    local_418 = (int *)0x0;
    local_428 = (int *)0x0;
    iStack_420._M_current = (int *)0x0;
    bVar5 = true;
    this_01 = &this->SourceLabels;
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    local_408 = this;
    while( true ) {
      bVar2 = cmsys::SystemTools::GetLineFromStream((istream *)&local_238,&local_448,(bool *)0x0,-1)
      ;
      if (!bVar2) break;
      if (local_448._M_string_length != 0) {
        if (*local_448._M_dataplus._M_p != '#') {
          if (*local_448._M_dataplus._M_p == ' ') {
            std::__cxx11::string::substr((ulong)local_400,(ulong)&local_448);
            local_44c = GetLabelId(local_408,(string *)local_400);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(local_3b8,&local_44c);
            if (bVar5) {
              if (iStack_420._M_current == local_418) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_428,iStack_420,&local_44c);
              }
              else {
                *iStack_420._M_current = local_44c;
                iStack_420._M_current = iStack_420._M_current + 1;
              }
            }
            else {
              p_Var3 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
                       ::operator[](this_01,(key_type *)local_3b0);
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>(p_Var3,&local_44c);
            }
            if ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                local_400._0_8_ !=
                (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                (local_400 + 0x10)) {
              operator_delete((void *)local_400._0_8_,local_3f0._M_allocated_capacity + 1);
            }
          }
          else {
            cmCTest::GetShortPathToFile_abi_cxx11_
                      ((string *)local_400,(local_408->super_cmCTestGenericHandler).CTest,
                       local_448._M_dataplus._M_p);
            std::__cxx11::string::operator=((string *)local_3b0,(string *)local_400);
            if ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                local_400._0_8_ !=
                (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                (local_400 + 0x10)) {
              operator_delete((void *)local_400._0_8_,local_3f0._M_allocated_capacity + 1);
            }
            local_3c0 = this_01;
            p_Var3 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
                     ::operator[](this_01,(key_type *)local_3b0);
            iVar1._M_current = iStack_420._M_current;
            local_400._0_8_ = p_Var3;
            if (local_428 != iStack_420._M_current) {
              __v = local_428;
              do {
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique_<int&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                          (p_Var3,(_Base_ptr)(p_Var3 + 8),__v,(_Alloc_node *)local_400);
                __v = __v + 1;
              } while (__v != iVar1._M_current);
            }
            bVar5 = false;
            this_01 = local_3c0;
          }
        }
      }
    }
    if (local_428 != (int *)0x0) {
      operator_delete(local_428,(long)local_418 - (long)local_428);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,
                      CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                               local_448.field_2._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
      operator_delete((void *)local_3b0._0_8_,
                      CONCAT71(local_3a0[0]._M_allocated_capacity._1_7_,local_3a0[0]._M_local_buf[0]
                              ) + 1);
    }
  }
  std::ifstream::~ifstream(&local_238);
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0,local_3d0[0] + 1);
  }
  return;
}

Assistant:

void cmCTestCoverageHandler::LoadLabels(const char* dir)
{
  LabelSet& dirLabels = this->TargetDirs[dir];
  std::string fname = dir;
  fname += "/Labels.txt";
  cmsys::ifstream fin(fname.c_str());
  if (!fin) {
    return;
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " loading labels from [" << fname << "]\n", this->Quiet);
  bool inTarget = true;
  std::string source;
  std::string line;
  std::vector<int> targetLabels;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (line.empty() || line[0] == '#') {
      // Ignore blank and comment lines.
      continue;
    }
    if (line[0] == ' ') {
      // Label lines appear indented by one space.
      std::string label = line.substr(1);
      int id = this->GetLabelId(label);
      dirLabels.insert(id);
      if (inTarget) {
        targetLabels.push_back(id);
      } else {
        this->SourceLabels[source].insert(id);
      }
    } else {
      // Non-indented lines specify a source file name.  The first one
      // is the end of the target-wide labels.
      inTarget = false;

      source = this->CTest->GetShortPathToFile(line.c_str());

      // Label the source with the target labels.
      LabelSet& labelSet = this->SourceLabels[source];
      labelSet.insert(targetLabels.begin(), targetLabels.end());
    }
  }
}